

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O3

void save(void)

{
  FILE *__stream;
  int __c;
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  __stream = fopen("learned.txt","w");
  if (0 < num_c) {
    uVar3 = 0;
    do {
      fprintf(__stream,"%f",
              w0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar3]);
      __c = 0x2c;
      if (uVar3 == num_c - 1) {
        __c = 10;
      }
      fputc(__c,__stream);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)num_c);
    if (0 < num_c) {
      lVar4 = 0;
      do {
        fprintf(__stream,"%d\n",
                (ulong)(uint)shapelet_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar4]);
        if (0 < shapelet_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4]) {
          lVar2 = 0;
          do {
            fprintf(__stream,"%f,%d",
                    w.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar2],
                    (ulong)(uint)shapelet_length.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar2]);
            if (0 < shapelet_length.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar2]) {
              lVar1 = 0;
              do {
                fprintf(__stream,",%f",
                        *(undefined8 *)
                         (*(long *)&shapelet.
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar2].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + lVar1 * 8));
                lVar1 = lVar1 + 1;
              } while (lVar1 < shapelet_length.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar4].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar2]);
            }
            fputc(10,__stream);
            lVar2 = lVar2 + 1;
          } while (lVar2 < shapelet_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar4]);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < num_c);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void save() {
    FILE *f;
    f = fopen("learned.txt", "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%f", w0[i]);
        if (i != num_c - 1) {
            fprintf(f, ",");
        } else {
            fprintf(f, "\n");
        }
    }

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelet_n[i]);
        for (int j = 0; j < shapelet_n[i]; ++j) {
            fprintf(f, "%f,%d", w[i][j], shapelet_length[i][j]);
            for (int k = 0; k < shapelet_length[i][j]; ++k) {
                fprintf(f, ",%f", shapelet[i][j][k]);
            }
            fprintf(f, "\n");
        }
    }

    fclose(f);
}